

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O2

void bandit::use_default_formatters(choice_options *choices)

{
  allocator local_69;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string((string *)&local_68,"vs",&local_69);
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:55:34)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:55:34)>
             ::_M_manager;
  detail::option_map::add(&choices->formatters,&local_68,(controller_func_t *)&local_28,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"posix",&local_69);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:58:37)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:58:37)>
             ::_M_manager;
  detail::option_map::add(&choices->formatters,&local_68,(controller_func_t *)&local_48,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

inline void use_default_formatters(detail::choice_options& choices) {
    choices.formatters.add("vs", [&](detail::controller_t& controller) {
      controller.set_formatter(new failure_formatter::visual_studio());
    });
    choices.formatters.add("posix", [&](detail::controller_t& controller) {
      controller.set_formatter(new failure_formatter::posix());
    }, true);
  }